

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__time_step
          (ColladaParserAutoGen14Private *this)

{
  ParserChar **buffer;
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined1 uVar3;
  bool failed;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  buffer = &(this->
            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
            ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  GeneratedSaxParser::Utils::toFloat
            (buffer,(this->
                    super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                    ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack,&local_21);
  if (local_21 == false) {
    iVar2 = (*((this->
               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               ).mImpl)->_vptr_ColladaParserAutoGen14[0x28e])();
    uVar3 = (undefined1)iVar2;
  }
  else {
    bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                      ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                       ERROR_TEXTDATA_PARSING_FAILED,0x3b6d1c0,(ParserChar *)0x0,
                       (this->
                       super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData);
    uVar3 = !bVar1;
  }
  if (*buffer != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  *buffer = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return (bool)uVar3;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__time_step()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__time_step();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
float parameter = GeneratedSaxParser::Utils::toFloat((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__time_step(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_TIME_STEP, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}